

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager_p.h
# Opt level: O2

QNetworkReply * __thiscall
QRestAccessManagerPrivate::executeRequest
          (QRestAccessManagerPrivate *this,ReqOpRefJson requestOperation,QJsonDocument *jsonDoc,
          QNetworkRequest *request,QObject *context,QSlotObjectBase *rawSlot)

{
  QNetworkAccessManager *pQVar1;
  bool bVar2;
  QNetworkReply *pQVar3;
  long in_FS_OFFSET;
  QAnyStringView value;
  QSlotObjectBase *local_88;
  QArrayDataPointer<char> local_80;
  QLatin1String local_68;
  QHttpHeaders h;
  QNetworkRequest req;
  __uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> local_48;
  QNetworkAccessManager *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_t.
  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
  super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)rawSlot;
  if (this->qnam == (QNetworkAccessManager *)0x0) {
    warnNoAccessManager((QRestAccessManagerPrivate *)rawSlot);
    pQVar3 = (QNetworkReply *)0x0;
  }
  else {
    verifyThreadAffinity(this,context);
    req.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::QNetworkRequest(&req,request);
    h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::headers((QNetworkRequest *)&h);
    bVar2 = QHttpHeaders::contains(&h,ContentType);
    if (!bVar2) {
      QLatin1String::QLatin1String(&local_68,"application/json");
      value.m_size = local_68.m_size | 0x4000000000000000;
      value.field_0.m_data_utf8 = local_68.m_data;
      QHttpHeaders::append(&h,ContentType,value);
    }
    QNetworkRequest::setHeaders(&req,&h);
    pQVar1 = this->qnam;
    QJsonDocument::toJson((JsonFormat)&local_80);
    local_40 = pQVar1;
    pQVar3 = (*requestOperation.
               super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*,_const_QNetworkRequest_&,_const_QByteArray_&>
               .m_thunk_ptr)((BoundEntityType)
                             requestOperation.
                             super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*,_const_QNetworkRequest_&,_const_QByteArray_&>
                             .m_bound_entity.obj,&local_40,&req,(QByteArray *)&local_80);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
    local_88 = rawSlot;
    local_48._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
         (_Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)0x0;
    pQVar3 = createActiveRequest(this,pQVar3,context,(SlotObjUniquePtr)&local_88);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               &local_88);
    QHttpHeaders::~QHttpHeaders(&h);
    QNetworkRequest::~QNetworkRequest(&req);
  }
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *executeRequest(ReqOpRefJson requestOperation, const QJsonDocument &jsonDoc,
                               const QNetworkRequest &request,
                               const QObject *context, QtPrivate::QSlotObjectBase *rawSlot)
    {
        QtPrivate::SlotObjUniquePtr slot(rawSlot);
        if (!qnam)
            return warnNoAccessManager();
        verifyThreadAffinity(context);
        QNetworkRequest req(request);
        auto h = req.headers();
        if (!h.contains(QHttpHeaders::WellKnownHeader::ContentType)) {
            h.append(QHttpHeaders::WellKnownHeader::ContentType,
                     QLatin1StringView{"application/json"});
        }
        req.setHeaders(std::move(h));
        QNetworkReply *reply = requestOperation(qnam, req, jsonDoc.toJson(QJsonDocument::Compact));
        return createActiveRequest(reply, context, std::move(slot));
    }